

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitFunctionCall(RegSlot resultReg,RegSlot funcReg,RegSlot thisReg,RegSlot argReg,
                     ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ushort ArgCount;
  ProfileId callSiteId;
  ByteCodeWriter *pBVar1;
  ProfileId callSite;
  ArgSlot argCount;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot argReg_local;
  RegSlot thisReg_local;
  RegSlot funcReg_local;
  RegSlot resultReg_local;
  
  ArgCount = 2;
  if (argReg == 0xffffffff) {
    ArgCount = 1;
  }
  FuncInfo::StartRecordingOutArgs(funcInfo,(uint)ArgCount);
  callSiteId = ByteCodeGenerator::GetNextCallSiteId(byteCodeGenerator,CallI);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::StartCall(pBVar1,StartCall,ArgCount);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::ArgOut<true>(pBVar1,0,thisReg,callSiteId,false);
  if (argReg != 0xffffffff) {
    pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::ArgOut<true>(pBVar1,1,argReg,callSiteId,false);
  }
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::CallI(pBVar1,CallI,resultReg,funcReg,ArgCount,callSiteId,CallFlags_None);
  return;
}

Assistant:

void EmitFunctionCall(
    Js::RegSlot resultReg,
    Js::RegSlot funcReg,
    Js::RegSlot thisReg,
    Js::RegSlot argReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Js::ArgSlot argCount = argReg == Js::Constants::NoRegister ? 1 : 2;
    funcInfo->StartRecordingOutArgs(argCount);
    Js::ProfileId callSite = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);
    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);

    byteCodeGenerator->Writer()->ArgOut<true>(0, thisReg, callSite, false);

    if (argReg != Js::Constants::NoRegister)
        byteCodeGenerator->Writer()->ArgOut<true>(1, argReg, callSite, false);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, resultReg, funcReg, argCount, callSite);
}